

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog_p.h
# Opt level: O1

void __thiscall QAutoPointer<QFileDialog>::~QAutoPointer(QAutoPointer<QFileDialog> *this)

{
  Data *pDVar1;
  QObject *pQVar2;
  
  pDVar1 = (this->o).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar2 = (QObject *)0x0;
  }
  else {
    pQVar2 = (this->o).wp.value;
  }
  if (pQVar2 != (QObject *)0x0) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  pDVar1 = (this->o).wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if ((*(int *)pDVar1 == 0) && (pDVar1 = (this->o).wp.d, pDVar1 != (Data *)0x0)) {
      operator_delete(pDVar1);
      return;
    }
  }
  return;
}

Assistant:

~QAutoPointer() { delete o; }